

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O0

void __thiscall
TransactionContext_SequenceApiTestWithKey_Test::TestBody
          (TransactionContext_SequenceApiTestWithKey_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Amount fee;
  Address address2;
  Address address;
  UtxoData utxo2;
  UtxoData utxo1;
  AddressFactory factory;
  ByteData *in_stack_ffffffffffffde58;
  UtxoData *in_stack_ffffffffffffde60;
  UtxoData *in_stack_ffffffffffffde68;
  TransactionContext *in_stack_ffffffffffffde70;
  undefined7 in_stack_ffffffffffffde78;
  undefined1 in_stack_ffffffffffffde7f;
  undefined7 in_stack_ffffffffffffde88;
  undefined1 in_stack_ffffffffffffde8f;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffde90;
  OutPoint *in_stack_ffffffffffffde98;
  undefined7 in_stack_ffffffffffffdea0;
  undefined1 in_stack_ffffffffffffdea7;
  UtxoData *in_stack_ffffffffffffdec0;
  allocator *paVar4;
  undefined2 in_stack_ffffffffffffdec8;
  undefined1 in_stack_ffffffffffffdeca;
  undefined1 in_stack_ffffffffffffdecb;
  undefined1 in_stack_ffffffffffffdecc;
  undefined1 in_stack_ffffffffffffdecd;
  undefined1 in_stack_ffffffffffffdece;
  undefined1 in_stack_ffffffffffffdecf;
  UtxoData *in_stack_ffffffffffffded0;
  Address *in_stack_ffffffffffffded8;
  undefined6 in_stack_ffffffffffffdee0;
  undefined1 in_stack_ffffffffffffdee6;
  undefined1 in_stack_ffffffffffffdee7;
  undefined8 **local_20d8;
  AssertHelper local_2070;
  Message local_2068;
  string local_2060;
  AssertionResult local_2040;
  AssertHelper local_2030;
  Message local_2028;
  int64_t local_2020;
  int64_t local_2018;
  undefined1 local_2010;
  Amount local_2008;
  int64_t local_1ff8;
  AssertionResult local_1ff0;
  AssertHelper local_1fe0;
  Message local_1fd8 [4];
  AssertHelper local_1fb8;
  Message local_1fb0;
  OutPoint local_1fa8;
  AssertHelper local_1f80;
  Message local_1f78;
  SigHashType local_1f70;
  allocator local_1f61;
  string local_1f60;
  Privkey local_1f40;
  allocator local_1f19;
  string local_1f18;
  Pubkey local_1ef8;
  OutPoint local_1ee0;
  AssertHelper local_1eb8;
  Message local_1eb0 [5];
  byte local_1e81;
  ConstCharPtr local_1e80;
  AssertHelper local_1e78;
  Message local_1e70;
  OutPoint local_1e68;
  AssertHelper local_1e40;
  Message local_1e38;
  SigHashType local_1e30;
  allocator local_1e21;
  string local_1e20;
  Privkey local_1e00;
  allocator local_1dd9;
  string local_1dd8;
  Pubkey local_1db8;
  OutPoint local_1da0;
  ByteData local_1d78;
  AssertHelper local_1d60;
  Message local_1d58 [2];
  undefined1 **local_1d48;
  undefined8 *local_1d40 [43];
  undefined1 in_stack_ffffffffffffe41f;
  SigHashType *in_stack_ffffffffffffe420;
  Privkey *in_stack_ffffffffffffe428;
  Pubkey *in_stack_ffffffffffffe430;
  OutPoint *in_stack_ffffffffffffe438;
  TransactionContext *in_stack_ffffffffffffe440;
  ByteData256 *in_stack_ffffffffffffe450;
  ByteData *in_stack_ffffffffffffe458;
  TransactionContext *in_stack_ffffffffffffe4f0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe508;
  TransactionContext *in_stack_ffffffffffffe510;
  undefined1 local_1850 [632];
  OutPoint *in_stack_ffffffffffffea28;
  TransactionContext *in_stack_ffffffffffffea30;
  undefined1 **local_1360;
  undefined8 local_1358;
  int64_t local_1338;
  undefined1 local_1330;
  int64_t local_1328;
  undefined1 local_1320;
  OutPoint local_1318;
  AssertHelper local_12f0;
  Message local_12e8 [25];
  Amount local_1220;
  allocator local_1209;
  string local_1208;
  Address local_11e8;
  allocator local_1069;
  string local_1068;
  Address local_1048;
  Amount local_ed0;
  allocator local_eb9;
  string local_eb8 [32];
  Address local_e98;
  allocator local_d19;
  string local_d18;
  Script local_cf8;
  allocator local_cb9;
  string local_cb8;
  Txid local_c98;
  undefined8 local_c78;
  Txid local_c50;
  uint32_t local_c30;
  Script local_c28 [2];
  Address local_bb8;
  string local_a40 [32];
  int64_t local_a20;
  undefined1 local_a18;
  undefined4 local_a10;
  undefined8 local_a08;
  Amount local_788;
  allocator local_771;
  string local_770 [32];
  Address local_750;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0 [2];
  Address local_460;
  string local_2e8 [32];
  Amount local_2c8;
  undefined4 local_2b8;
  undefined8 local_2b0;
  
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffde60,
             (NetType)((ulong)in_stack_ffffffffffffde58 >> 0x20));
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffdec0);
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2480f6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffde60);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",&local_771);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffde68,(string *)in_stack_ffffffffffffde60);
  cfd::core::Address::operator=(&local_460,&local_750);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffde60);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_788,10000000);
  local_2c8.ignore_check_ = local_788.ignore_check_;
  local_2c8.amount_ = local_788.amount_;
  local_2b8 = 2;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffdec0);
  local_c78 = 0;
  local_a08 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cb8,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_cb9);
  cfd::core::Txid::Txid(&local_c98,&local_cb8);
  cfd::core::Txid::operator=(&local_c50,&local_c98);
  cfd::core::Txid::~Txid((Txid *)0x24831b);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  local_c30 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d18,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d19);
  cfd::core::Script::Script(&local_cf8,&local_d18);
  cfd::core::Script::operator=(local_c28,&local_cf8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffde60);
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",&local_eb9);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffde68,(string *)in_stack_ffffffffffffde60);
  cfd::core::Address::operator=(&local_bb8,&local_e98);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffde60);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::__cxx11::string::operator=
            (local_a40,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_ed0,180000);
  local_a18 = local_ed0.ignore_check_;
  local_a20 = local_ed0.amount_;
  local_a10 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1068,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_1069);
  cfd::core::Address::Address(&local_1048,&local_1068);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator((allocator<char> *)&local_1069);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1208,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_1209);
  cfd::core::Address::Address(&local_11e8,&local_1208);
  std::__cxx11::string::~string((string *)&local_1208);
  std::allocator<char>::~allocator((allocator<char> *)&local_1209);
  cfd::core::Amount::Amount(&local_1220,10000);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffde60,
             (uint32_t)((ulong)in_stack_ffffffffffffde58 >> 0x20),
             (uint32_t)in_stack_ffffffffffffde58);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::AddInput(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
    }
  }
  else {
    testing::Message::Message(local_12e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_12f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1b4,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_12f0,local_12e8);
    testing::internal::AssertHelper::~AssertHelper(&local_12f0);
    testing::Message::~Message((Message *)0x248a31);
  }
  cfd::core::OutPoint::OutPoint(&local_1318,&local_c50,local_c30);
  cfd::TransactionContext::AddTxIn
            ((TransactionContext *)CONCAT17(in_stack_ffffffffffffdea7,in_stack_ffffffffffffdea0),
             in_stack_ffffffffffffde98);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x248abe);
  AVar3 = cfd::core::operator-(&local_2c8,&local_1220);
  local_1338 = AVar3.amount_;
  local_1330 = AVar3.ignore_check_;
  local_1328 = local_1338;
  local_1320 = local_1330;
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffdee7,
                      CONCAT16(in_stack_ffffffffffffdee6,in_stack_ffffffffffffdee0)),
             in_stack_ffffffffffffded8,(Amount *)in_stack_ffffffffffffded0);
  cfd::TransactionContext::AddTxOut
            ((TransactionContext *)
             CONCAT17(in_stack_ffffffffffffdee7,
                      CONCAT16(in_stack_ffffffffffffdee6,in_stack_ffffffffffffdee0)),
             in_stack_ffffffffffffded8,(Amount *)in_stack_ffffffffffffded0);
  local_1d48 = (undefined1 **)local_1d40;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffded0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffdecf,
                      CONCAT16(in_stack_ffffffffffffdece,
                               CONCAT15(in_stack_ffffffffffffdecd,
                                        CONCAT14(in_stack_ffffffffffffdecc,
                                                 CONCAT13(in_stack_ffffffffffffdecb,
                                                          CONCAT12(in_stack_ffffffffffffdeca,
                                                                   in_stack_ffffffffffffdec8)))))));
  local_1d48 = (undefined1 **)local_1850;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffded0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffdecf,
                      CONCAT16(in_stack_ffffffffffffdece,
                               CONCAT15(in_stack_ffffffffffffdecd,
                                        CONCAT14(in_stack_ffffffffffffdecc,
                                                 CONCAT13(in_stack_ffffffffffffdecb,
                                                          CONCAT12(in_stack_ffffffffffffdeca,
                                                                   in_stack_ffffffffffffdec8)))))));
  local_1360 = (undefined1 **)local_1d40;
  local_1358 = 2;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x248bcd);
  __l._M_len._0_7_ = in_stack_ffffffffffffdea0;
  __l._M_array = (iterator)in_stack_ffffffffffffde98;
  __l._M_len._7_1_ = in_stack_ffffffffffffdea7;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffde90,__l,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x248c01);
  local_20d8 = &local_1360;
  do {
    local_20d8 = local_20d8 + -0x9e;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffde60);
  } while (local_20d8 != local_1d40);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo(in_stack_ffffffffffffe510,in_stack_ffffffffffffe508)
      ;
    }
  }
  else {
    testing::Message::Message(local_1d58);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ba,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1d60,local_1d58);
    testing::internal::AssertHelper::~AssertHelper(&local_1d60);
    testing::Message::~Message((Message *)0x248e80);
  }
  cfd::core::ByteData::ByteData(&local_1d78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1da0,&local_4f8,local_4d8);
      paVar4 = &local_1dd9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1dd8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar4);
      cfd::core::Pubkey::Pubkey(&local_1db8,&local_1dd8);
      paVar4 = &local_1e21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e20,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",paVar4
                );
      cfd::core::Privkey::FromWif(&local_1e00,&local_1e20,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1e30);
      in_stack_ffffffffffffde60 = (UtxoData *)0x0;
      in_stack_ffffffffffffde58 = (ByteData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438,in_stack_ffffffffffffe430,
                 in_stack_ffffffffffffe428,in_stack_ffffffffffffe420,(bool)in_stack_ffffffffffffe41f
                 ,in_stack_ffffffffffffe450,in_stack_ffffffffffffe458);
      cfd::core::Privkey::~Privkey((Privkey *)0x24902c);
      std::__cxx11::string::~string((string *)&local_1e20);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x249053);
      std::__cxx11::string::~string((string *)&local_1dd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1dd9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x24907a);
    }
  }
  else {
    testing::Message::Message(&local_1e38);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c1,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1e40,&local_1e38);
    testing::internal::AssertHelper::~AssertHelper(&local_1e40);
    testing::Message::~Message((Message *)0x24920c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1e68,&local_4f8,local_4d8);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2492c9);
    }
  }
  else {
    testing::Message::Message(&local_1e70);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c2,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1e78,&local_1e70);
    testing::internal::AssertHelper::~AssertHelper(&local_1e78);
    testing::Message::~Message((Message *)0x249393);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_1e80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_1e80);
  if (bVar1) {
    local_1e81 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((TransactionContext *)in_stack_ffffffffffffde68);
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffde60,in_stack_ffffffffffffde58);
      cfd::core::ByteData::~ByteData((ByteData *)0x24946d);
    }
    if ((local_1e81 & 1) != 0) goto LAB_002495c3;
    local_1e80.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1eb0);
  testing::internal::AssertHelper::AssertHelper
            (&local_1eb8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
             ,0x1c4,local_1e80.value);
  testing::internal::AssertHelper::operator=(&local_1eb8,local_1eb0);
  testing::internal::AssertHelper::~AssertHelper(&local_1eb8);
  testing::Message::~Message((Message *)0x249578);
LAB_002495c3:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1ee0,&local_c50,local_c30);
      paVar4 = &local_1f19;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f18,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",paVar4);
      cfd::core::Pubkey::Pubkey(&local_1ef8,&local_1f18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f60,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_1f61);
      cfd::core::Privkey::FromWif(&local_1f40,&local_1f60,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_1f70);
      in_stack_ffffffffffffde60 = (UtxoData *)0x0;
      in_stack_ffffffffffffde58 = (ByteData *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438,in_stack_ffffffffffffe430,
                 in_stack_ffffffffffffe428,in_stack_ffffffffffffe420,(bool)in_stack_ffffffffffffe41f
                 ,in_stack_ffffffffffffe450,in_stack_ffffffffffffe458);
      cfd::core::Privkey::~Privkey((Privkey *)0x249703);
      std::__cxx11::string::~string((string *)&local_1f60);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f61);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x24972a);
      std::__cxx11::string::~string((string *)&local_1f18);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f19);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x249751);
    }
  }
  else {
    testing::Message::Message(&local_1f78);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1c9,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1f80,&local_1f78);
    testing::internal::AssertHelper::~AssertHelper(&local_1f80);
    testing::Message::~Message((Message *)0x2498ca);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_1fa8,&local_c50,local_c30);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x249987);
    }
  }
  else {
    testing::Message::Message(&local_1fb0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1fb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1ca,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1fb8,&local_1fb0);
    testing::internal::AssertHelper::~AssertHelper(&local_1fb8);
    testing::Message::~Message((Message *)0x249a51);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((TransactionContext *)in_stack_ffffffffffffde68);
      cfd::core::ByteData::operator=
                ((ByteData *)in_stack_ffffffffffffde60,in_stack_ffffffffffffde58);
      cfd::core::ByteData::~ByteData((ByteData *)0x249b02);
    }
  }
  else {
    testing::Message::Message(local_1fd8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1fe0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cb,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1fe0,local_1fd8);
    testing::internal::AssertHelper::~AssertHelper(&local_1fe0);
    testing::Message::~Message((Message *)0x249ba9);
  }
  AVar3 = cfd::TransactionContext::GetFeeAmount(in_stack_ffffffffffffe4f0);
  local_2018 = AVar3.amount_;
  local_2010 = AVar3.ignore_check_;
  local_2008.amount_ = local_2018;
  local_2008.ignore_check_ = (bool)local_2010;
  local_1ff8 = cfd::core::Amount::GetSatoshiValue(&local_2008);
  local_2020 = cfd::core::Amount::GetSatoshiValue(&local_1220);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_ffffffffffffde7f,in_stack_ffffffffffffde78),
             (char *)in_stack_ffffffffffffde70,(long *)in_stack_ffffffffffffde68,
             (long *)in_stack_ffffffffffffde60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1ff0);
  if (!bVar1) {
    testing::Message::Message(&local_2028);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x249d08);
    testing::internal::AssertHelper::AssertHelper
              (&local_2030,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2030,&local_2028);
    testing::internal::AssertHelper::~AssertHelper(&local_2030);
    testing::Message::~Message((Message *)0x249d65);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249dbd);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2060,&local_1d78);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2040,"tx.GetHex().c_str()",
             "\"02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000\""
             ,pcVar2,
             "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000"
            );
  std::__cxx11::string::~string((string *)&local_2060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2040);
  if (!bVar1) {
    testing::Message::Message(&local_2068);
    in_stack_ffffffffffffde70 =
         (TransactionContext *)
         testing::AssertionResult::failure_message((AssertionResult *)0x249ea4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2070,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x1cd,(char *)in_stack_ffffffffffffde70);
    testing::internal::AssertHelper::operator=(&local_2070,&local_2068);
    testing::internal::AssertHelper::~AssertHelper(&local_2070);
    testing::Message::~Message((Message *)0x249f01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x249f56);
  cfd::core::ByteData::~ByteData((ByteData *)0x249f63);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffde70);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffde60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffde60);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffde60);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffde60);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffde60);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x249fbe);
  return;
}

Assistant:

TEST(TransactionContext, SequenceApiTestWithKey)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000102a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402205d038d82d3d7043f21b9b3d0e3ea85225ffcb78d02b8531cb1ddbec7e577e7460220367c0b985b1bb76de1f95ce4696ad9717f28ed6a356765cf31a894c42f3bb81201210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff02706f9800000000001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac20bf02000000000016001445663e592ff613587f0fdd6e74034c5239710dca00024730440220572c4f56643d35a229bf632810ee947190414285b790e841f9e664dfd8e1f25d022021d8e4b01c08ad50bf3f1b6edfb25bb9dc8640b36dce1e26bff352097068d07f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000000");
}